

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetri.cpp
# Opt level: O2

PlaneTriResult
planeTriIntersection
          (float *plane,float *triangle,uint tstride,float epsilon,float *front,uint *fcount,
          float *back,uint *bcount)

{
  PlaneTriResult PVar1;
  PlaneTriResult PVar2;
  PlaneTriResult PVar3;
  uint *puVar4;
  float *pfVar5;
  float *pfVar6;
  float *p;
  float split [3];
  
  *fcount = 0;
  pfVar6 = (float *)((ulong)tstride + (long)triangle);
  p = (float *)((ulong)(tstride * 2) + (long)triangle);
  *bcount = 0;
  PVar1 = getSidePlane(triangle,plane,epsilon);
  PVar2 = getSidePlane(pfVar6,plane,epsilon);
  PVar3 = getSidePlane(p,plane,epsilon);
  if (PVar1 == PVar3 && PVar1 == PVar2) {
    if (PVar1 != PTR_FRONT) {
      add(triangle,back,tstride,bcount);
      add(pfVar6,back,tstride,bcount);
      add(p,back,tstride,bcount);
      return PTR_BACK;
    }
    add(triangle,front,tstride,fcount);
    add(pfVar6,front,tstride,fcount);
    add(p,front,tstride,fcount);
    return PTR_FRONT;
  }
  if (PVar1 == PVar2) {
    if (PVar1 == PTR_FRONT) {
      add(triangle,front,tstride,fcount);
      puVar4 = fcount;
      pfVar5 = front;
    }
    else {
      add(triangle,back,tstride,bcount);
      puVar4 = bcount;
      pfVar5 = back;
    }
    add(pfVar6,pfVar5,tstride,puVar4);
  }
  else {
    intersect(triangle,pfVar6,split,plane);
    if (PVar1 == PTR_FRONT) {
      add(triangle,front,tstride,fcount);
      add(split,front,tstride,fcount);
      add(split,back,tstride,bcount);
      puVar4 = bcount;
      pfVar5 = back;
    }
    else {
      add(triangle,back,tstride,bcount);
      add(split,back,tstride,bcount);
      add(split,front,tstride,fcount);
      puVar4 = fcount;
      pfVar5 = front;
    }
    add(pfVar6,pfVar5,tstride,puVar4);
  }
  if (PVar2 == PVar3) {
    puVar4 = bcount;
    pfVar6 = back;
    if (PVar2 == PTR_FRONT) {
      add(p,front,tstride,fcount);
      goto LAB_00e30b32;
    }
  }
  else {
    intersect(pfVar6,p,split,plane);
    add(split,front,tstride,fcount);
    add(split,back,tstride,bcount);
    puVar4 = fcount;
    pfVar6 = front;
    if (PVar3 != PTR_FRONT) {
      puVar4 = bcount;
      pfVar6 = back;
    }
  }
  add(p,pfVar6,tstride,puVar4);
LAB_00e30b32:
  if (PVar1 != PVar3) {
    intersect(p,triangle,split,plane);
    add(split,front,tstride,fcount);
    add(split,back,tstride,bcount);
  }
  return PTR_SPLIT;
}

Assistant:

PlaneTriResult planeTriIntersection(const float *plane,    // the plane equation in Ax+By+Cz+D format
                                    const float *triangle, // the source triangle.
                                    unsigned int tstride,  // stride in bytes of the input and output triangles
                                    float        epsilon,  // the co-planer epsilon value.
                                    float       *front,    // the triangle in front of the
                                    unsigned int &fcount,  // number of vertices in the 'front' triangle
                                    float       *back,     // the triangle in back of the plane
                                    unsigned int &bcount) // the number of vertices in the 'back' triangle.
{
  fcount = 0;
  bcount = 0;

  const char *tsource = (const char *) triangle;

  // get the three vertices of the triangle.
  const float *p1     = (const float *) (tsource);
  const float *p2     = (const float *) (tsource+tstride);
  const float *p3     = (const float *) (tsource+tstride*2);


  PlaneTriResult r1   = getSidePlane(p1,plane,epsilon); // compute the side of the plane each vertex is on
  PlaneTriResult r2   = getSidePlane(p2,plane,epsilon);
  PlaneTriResult r3   = getSidePlane(p3,plane,epsilon);

  if ( r1 == r2 && r1 == r3 ) // if all three vertices are on the same side of the plane.
  {
    if ( r1 == PTR_FRONT ) // if all three are in front of the plane, then copy to the 'front' output triangle.
    {
      add(p1,front,tstride,fcount);
      add(p2,front,tstride,fcount);
      add(p3,front,tstride,fcount);
    }
    else
    {
      add(p1,back,tstride,bcount); // if all three are in 'abck' then copy to the 'back' output triangle.
      add(p2,back,tstride,bcount);
      add(p3,back,tstride,bcount);
    }
    return r1; // if all three points are on the same side of the plane return result
  }

  // ok.. we need to split the triangle at the plane.

  // First test ray segment P1 to P2
  if ( r1 == r2 ) // if these are both on the same side...
  {
    if ( r1 == PTR_FRONT )
    {
      add( p1, front, tstride, fcount );
      add( p2, front, tstride, fcount );
    }
    else
    {
      add( p1, back, tstride, bcount );
      add( p2, back, tstride, bcount );
    }
  }
  else
  {
    float split[3]; // split the point
    intersect(p1,p2,split,plane);

    if ( r1 == PTR_FRONT )
    {

      add(p1, front, tstride, fcount );
      add(split, front, tstride, fcount );

      add(split, back, tstride, bcount );
      add(p2, back, tstride, bcount );

    }
    else
    {
      add(p1, back, tstride, bcount );
      add(split, back, tstride, bcount );

      add(split, front, tstride, fcount );
      add(p2, front, tstride, fcount );
    }

  }

  // Next test ray segment P2 to P3
  if ( r2 == r3 ) // if these are both on the same side...
  {
    if ( r3 == PTR_FRONT )
    {
      add( p3, front, tstride, fcount );
    }
    else
    {
      add( p3, back, tstride, bcount );
    }
  }
  else
  {
    float split[3]; // split the point
    intersect(p2,p3,split,plane);

    if ( r3 == PTR_FRONT )
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );

      add(p3, front, tstride, fcount );
    }
    else
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );

      add(p3, back, tstride, bcount );
    }
  }

  // Next test ray segment P3 to P1
  if ( r3 != r1 ) // if these are both on the same side...
  {
    float split[3]; // split the point

    intersect(p3,p1,split,plane);

    if ( r1 == PTR_FRONT )
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );
    }
    else
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );
    }
  }



  return PTR_SPLIT;
}